

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O3

int __thiscall ncnn::LSTM_x86::create_pipeline_int8(LSTM_x86 *this,Option *opt)

{
  void *pvVar1;
  long lVar2;
  uint _h;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  int *piVar15;
  Allocator *pAVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  undefined1 *puVar24;
  long lVar25;
  undefined4 *puVar26;
  long lVar27;
  long lVar28;
  uint _c;
  int iVar29;
  long lVar30;
  long lVar31;
  void *pvVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  long lVar44;
  void *pvVar45;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  ulong uVar50;
  uint uVar51;
  void *pvVar52;
  ulong uVar53;
  ulong local_1b8;
  void *local_1a0;
  void *local_198;
  void *local_168;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  
  _c = ((this->super_LSTM).direction == 2) + 1;
  uVar19 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
  _h = (this->super_LSTM).hidden_size;
  uVar46 = (ulong)_h;
  iVar17 = (int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                (long)(int)_h);
  iVar29 = iVar17 + 3;
  if (-1 < iVar17) {
    iVar29 = iVar17;
  }
  iVar29 = iVar29 >> 2;
  iVar3 = (this->super_LSTM).num_output;
  Mat::create(&this->weight_data_tm,iVar3 + iVar29,_h,_c,4,4,(Allocator *)0x0);
  Mat::create(&this->weight_data_tm_int8_descales,8,_h,_c,4,(Allocator *)0x0);
  local_1b8 = 0;
  Mat::create(&this->bias_c_data_packed,_h,1,_c,0x10,4,(Allocator *)0x0);
  uVar19 = (ulong)(_h * 2);
  uVar20 = (ulong)(_h * 3);
  do {
    if (0 < (int)_h) {
      pvVar5 = (this->super_LSTM).weight_xc_data.data;
      lVar30 = (this->super_LSTM).weight_xc_data.cstep * local_1b8;
      sVar6 = (this->super_LSTM).weight_xc_data.elemsize;
      lVar25 = (long)(this->super_LSTM).weight_xc_data.w;
      lVar33 = sVar6 * lVar25;
      pvVar1 = (void *)((long)pvVar5 + lVar30 * sVar6);
      sVar7 = (this->super_LSTM).bias_c_data.elemsize;
      lVar31 = (this->super_LSTM).bias_c_data.cstep * local_1b8 * sVar7;
      sVar8 = (this->weight_data_tm).cstep;
      sVar9 = (this->weight_data_tm_int8_descales).elemsize;
      lVar48 = (this->weight_data_tm_int8_descales).cstep * local_1b8 * sVar9;
      lVar22 = (long)(this->super_LSTM).bias_c_data.w * sVar7;
      iVar4 = (this->weight_data_tm_int8_descales).w;
      sVar7 = (this->weight_data_tm).elemsize;
      lVar34 = (uVar20 * lVar25 + lVar30) * sVar6;
      lVar38 = (uVar19 * lVar25 + lVar30) * sVar6;
      lVar25 = (lVar25 * uVar46 + lVar30) * sVar6;
      lVar23 = (long)(this->weight_data_tm).w * sVar7;
      pvVar10 = (this->weight_data_tm).data;
      pvVar52 = (void *)(sVar8 * sVar7 * local_1b8 + (long)pvVar10);
      pvVar43 = (void *)((long)pvVar5 + lVar25);
      local_f0 = (long)pvVar5 + lVar30 * sVar6 + 1;
      local_f8 = (long)pvVar5 + lVar25 + 1;
      pvVar45 = (void *)((long)pvVar5 + lVar38);
      local_100 = (long)pvVar5 + lVar38 + 1;
      pvVar32 = (void *)((long)pvVar5 + lVar34);
      local_108 = (long)pvVar5 + lVar34 + 1;
      lVar35 = (this->super_LSTM).weight_hc_data.cstep * local_1b8;
      sVar6 = (this->super_LSTM).weight_hc_data.elemsize;
      lVar34 = (long)(this->super_LSTM).weight_hc_data.w;
      lVar25 = sVar6 * lVar34;
      lVar30 = (uVar20 * lVar34 + lVar35) * sVar6;
      lVar38 = (uVar19 * lVar34 + lVar35) * sVar6;
      lVar34 = (lVar34 * uVar46 + lVar35) * sVar6;
      pvVar11 = (this->super_LSTM).bias_c_data.data;
      lVar39 = (long)(this->super_LSTM).weight_xc_data_int8_scales.w * local_1b8 *
               (this->super_LSTM).weight_xc_data_int8_scales.elemsize;
      pvVar12 = (this->super_LSTM).weight_xc_data_int8_scales.data;
      lVar40 = (long)(this->super_LSTM).weight_hc_data_int8_scales.w * local_1b8 *
               (this->super_LSTM).weight_hc_data_int8_scales.elemsize;
      pvVar13 = (this->super_LSTM).weight_hc_data_int8_scales.data;
      pvVar14 = (this->super_LSTM).weight_hc_data.data;
      pvVar5 = (void *)((long)pvVar14 + lVar35 * sVar6);
      local_118 = (long)pvVar14 + lVar35 * sVar6 + 1;
      local_198 = (void *)((long)pvVar14 + lVar34);
      local_120 = (long)pvVar14 + lVar34 + 1;
      local_168 = (void *)((long)pvVar14 + lVar38);
      local_128 = (long)pvVar14 + lVar38 + 1;
      local_1a0 = (void *)((long)pvVar14 + lVar30);
      local_130 = (long)pvVar14 + lVar30 + 1;
      pvVar14 = (this->weight_data_tm_int8_descales).data;
      puVar26 = (undefined4 *)
                ((this->bias_c_data_packed).cstep * local_1b8 * (this->bias_c_data_packed).elemsize
                + (long)(this->bias_c_data_packed).data);
      uVar53 = 0;
      pvVar41 = pvVar1;
      pvVar42 = pvVar5;
      do {
        puVar36 = (undefined1 *)((long)pvVar10 + lVar23 * uVar53 + sVar8 * local_1b8 * sVar7);
        uVar51 = 0;
        *puVar26 = *(undefined4 *)((long)pvVar11 + uVar53 * 4 + lVar31);
        puVar26[1] = *(undefined4 *)((long)pvVar11 + uVar53 * 4 + lVar22 + lVar31);
        puVar26[2] = *(undefined4 *)((long)pvVar11 + uVar53 * 4 + lVar22 * 2 + lVar31);
        puVar26[3] = *(undefined4 *)((long)pvVar11 + uVar53 * 4 + lVar22 * 3 + lVar31);
        if (0x1f < iVar17) {
          lVar30 = 7;
          do {
            puVar37 = puVar36;
            lVar34 = lVar30 * 4;
            *(undefined8 *)((long)pvVar52 + lVar30 * 4 + -0x1c) =
                 *(undefined8 *)((long)pvVar41 + lVar30 + -7);
            *(undefined8 *)((long)pvVar52 + lVar30 * 4 + -0x14) =
                 *(undefined8 *)((long)pvVar43 + lVar30 + -7);
            *(undefined8 *)((long)pvVar52 + lVar30 * 4 + -0xc) =
                 *(undefined8 *)((long)pvVar45 + lVar30 + -7);
            *(undefined8 *)((long)pvVar52 + lVar30 * 4 + -4) =
                 *(undefined8 *)((long)pvVar32 + lVar30 + -7);
            lVar30 = lVar30 + 8;
            puVar36 = (undefined1 *)((long)pvVar52 + lVar34 + 4);
          } while (lVar30 < iVar29);
          puVar36 = puVar37 + 0x20;
          uVar51 = (int)lVar30 - 7;
        }
        if ((int)(uVar51 | 3) < iVar29) {
          uVar21 = (ulong)uVar51;
          lVar30 = local_f0 + uVar21;
          lVar34 = local_f8 + uVar21;
          lVar38 = local_100 + uVar21;
          lVar35 = local_108 + uVar21;
          lVar27 = 0;
          lVar49 = 0;
          do {
            puVar36[lVar49 * 4] = *(undefined1 *)(lVar30 + -1 + lVar49);
            puVar36[lVar49 * 4 + 1] = *(undefined1 *)(lVar30 + lVar49);
            puVar36[lVar49 * 4 + 2] = *(undefined1 *)(lVar30 + 1 + lVar49);
            puVar36[lVar49 * 4 + 3] = *(undefined1 *)(lVar30 + 2 + lVar49);
            puVar36[lVar49 * 4 + 4] = *(undefined1 *)(lVar34 + -1 + lVar49);
            puVar36[lVar49 * 4 + 5] = *(undefined1 *)(lVar34 + lVar49);
            puVar36[lVar49 * 4 + 6] = *(undefined1 *)(lVar34 + 1 + lVar49);
            puVar36[lVar49 * 4 + 7] = *(undefined1 *)(lVar34 + 2 + lVar49);
            puVar36[lVar49 * 4 + 8] = *(undefined1 *)(lVar38 + -1 + lVar49);
            puVar36[lVar49 * 4 + 9] = *(undefined1 *)(lVar38 + lVar49);
            puVar36[lVar49 * 4 + 10] = *(undefined1 *)(lVar38 + 1 + lVar49);
            puVar36[lVar49 * 4 + 0xb] = *(undefined1 *)(lVar38 + 2 + lVar49);
            puVar36[lVar49 * 4 + 0xc] = *(undefined1 *)(lVar35 + -1 + lVar49);
            puVar36[lVar49 * 4 + 0xd] = *(undefined1 *)(lVar35 + lVar49);
            puVar36[lVar49 * 4 + 0xe] = *(undefined1 *)(lVar35 + 1 + lVar49);
            puVar36[lVar49 * 4 + 0xf] = *(undefined1 *)(lVar35 + 2 + lVar49);
            iVar18 = (int)lVar49;
            lVar49 = lVar49 + 4;
            lVar27 = lVar27 + 0x10;
          } while ((int)(uVar51 + iVar18 + 4 | 3) < iVar29);
          uVar51 = uVar51 + (int)lVar49;
          puVar36 = puVar36 + lVar27;
        }
        lVar30 = uVar53 + uVar46;
        lVar34 = uVar53 + uVar19;
        lVar38 = uVar20 + uVar53;
        uVar47 = uVar51 | 1;
        if ((int)uVar47 < iVar29) {
          uVar21 = (ulong)uVar51;
          lVar35 = 0;
          puVar37 = puVar36;
          do {
            puVar24 = puVar37;
            puVar37 = puVar36 + lVar35 * 4;
            *puVar37 = *(undefined1 *)((long)pvVar41 + lVar35 + uVar21);
            uVar50 = (ulong)uVar47;
            puVar37[1] = *(undefined1 *)((long)pvVar1 + uVar50 + uVar53 * lVar33);
            puVar37[2] = *(undefined1 *)((long)pvVar43 + lVar35 + uVar21);
            puVar37[3] = *(undefined1 *)((long)pvVar1 + uVar50 + lVar30 * lVar33);
            puVar37[4] = *(undefined1 *)((long)pvVar45 + lVar35 + uVar21);
            puVar37[5] = *(undefined1 *)((long)pvVar1 + uVar50 + lVar34 * lVar33);
            puVar37[6] = *(undefined1 *)((long)pvVar32 + lVar35 + uVar21);
            puVar37[7] = *(undefined1 *)((long)pvVar1 + uVar50 + lVar38 * lVar33);
            uVar47 = uVar51 + (int)lVar35 + 2 | 1;
            lVar35 = lVar35 + 2;
            puVar37 = puVar37 + 8;
          } while ((int)uVar47 < iVar29);
          puVar36 = puVar24 + 8;
          uVar51 = uVar51 + (int)lVar35;
        }
        if ((int)uVar51 < iVar29) {
          uVar21 = (ulong)uVar51;
          lVar35 = 0;
          puVar37 = puVar36;
          do {
            puVar24 = puVar37;
            puVar37 = puVar36 + lVar35 * 4;
            *puVar37 = *(undefined1 *)((long)pvVar41 + lVar35 + uVar21);
            puVar37[1] = *(undefined1 *)((long)pvVar43 + lVar35 + uVar21);
            puVar37[2] = *(undefined1 *)((long)pvVar45 + lVar35 + uVar21);
            puVar37[3] = *(undefined1 *)((long)pvVar32 + lVar35 + uVar21);
            lVar35 = lVar35 + 1;
            puVar37 = puVar37 + 4;
          } while ((int)((int)lVar35 + uVar51) < iVar29);
          puVar36 = puVar24 + 4;
        }
        uVar51 = 0;
        if (7 < iVar3) {
          lVar35 = 7;
          puVar37 = puVar36;
          do {
            puVar24 = puVar37;
            lVar27 = lVar35 * 4;
            *(undefined8 *)(puVar36 + lVar35 * 4 + -0x1c) =
                 *(undefined8 *)((long)pvVar42 + lVar35 + -7);
            *(undefined8 *)(puVar36 + lVar35 * 4 + -0x14) =
                 *(undefined8 *)((long)local_198 + lVar35 + -7);
            *(undefined8 *)(puVar36 + lVar35 * 4 + -0xc) =
                 *(undefined8 *)((long)local_168 + lVar35 + -7);
            *(undefined8 *)(puVar36 + lVar35 * 4 + -4) =
                 *(undefined8 *)((long)local_1a0 + lVar35 + -7);
            lVar35 = lVar35 + 8;
            puVar37 = puVar36 + lVar27 + 4;
          } while (lVar35 < iVar3);
          puVar36 = puVar24 + 0x20;
          uVar51 = (int)lVar35 - 7;
        }
        if ((int)(uVar51 | 3) < iVar3) {
          uVar21 = (ulong)uVar51;
          lVar35 = local_118 + uVar21;
          lVar27 = local_120 + uVar21;
          lVar49 = local_128 + uVar21;
          lVar2 = local_130 + uVar21;
          lVar28 = 0;
          lVar44 = 0;
          do {
            puVar36[lVar44 * 4] = *(undefined1 *)(lVar35 + -1 + lVar44);
            puVar36[lVar44 * 4 + 1] = *(undefined1 *)(lVar35 + lVar44);
            puVar36[lVar44 * 4 + 2] = *(undefined1 *)(lVar35 + 1 + lVar44);
            puVar36[lVar44 * 4 + 3] = *(undefined1 *)(lVar35 + 2 + lVar44);
            puVar36[lVar44 * 4 + 4] = *(undefined1 *)(lVar27 + -1 + lVar44);
            puVar36[lVar44 * 4 + 5] = *(undefined1 *)(lVar27 + lVar44);
            puVar36[lVar44 * 4 + 6] = *(undefined1 *)(lVar27 + 1 + lVar44);
            puVar36[lVar44 * 4 + 7] = *(undefined1 *)(lVar27 + 2 + lVar44);
            puVar36[lVar44 * 4 + 8] = *(undefined1 *)(lVar49 + -1 + lVar44);
            puVar36[lVar44 * 4 + 9] = *(undefined1 *)(lVar49 + lVar44);
            puVar36[lVar44 * 4 + 10] = *(undefined1 *)(lVar49 + 1 + lVar44);
            puVar36[lVar44 * 4 + 0xb] = *(undefined1 *)(lVar49 + 2 + lVar44);
            puVar36[lVar44 * 4 + 0xc] = *(undefined1 *)(lVar2 + -1 + lVar44);
            puVar36[lVar44 * 4 + 0xd] = *(undefined1 *)(lVar2 + lVar44);
            puVar36[lVar44 * 4 + 0xe] = *(undefined1 *)(lVar2 + 1 + lVar44);
            puVar36[lVar44 * 4 + 0xf] = *(undefined1 *)(lVar2 + 2 + lVar44);
            iVar18 = (int)lVar44;
            lVar44 = lVar44 + 4;
            lVar28 = lVar28 + 0x10;
          } while ((int)(uVar51 + iVar18 + 4 | 3) < iVar3);
          uVar51 = uVar51 + (int)lVar44;
          puVar36 = puVar36 + lVar28;
        }
        uVar47 = uVar51 | 1;
        if ((int)uVar47 < iVar3) {
          uVar21 = (ulong)uVar51;
          lVar35 = 0;
          puVar37 = puVar36;
          do {
            puVar24 = puVar37;
            puVar37 = puVar36 + lVar35 * 4;
            *puVar37 = *(undefined1 *)((long)pvVar42 + lVar35 + uVar21);
            uVar50 = (ulong)uVar47;
            puVar37[1] = *(undefined1 *)((long)pvVar5 + uVar50 + uVar53 * lVar25);
            puVar37[2] = *(undefined1 *)((long)local_198 + lVar35 + uVar21);
            puVar37[3] = *(undefined1 *)((long)pvVar5 + uVar50 + lVar30 * lVar25);
            puVar37[4] = *(undefined1 *)((long)local_168 + lVar35 + uVar21);
            puVar37[5] = *(undefined1 *)((long)pvVar5 + uVar50 + lVar34 * lVar25);
            puVar37[6] = *(undefined1 *)((long)local_1a0 + lVar35 + uVar21);
            puVar37[7] = *(undefined1 *)((long)pvVar5 + uVar50 + lVar38 * lVar25);
            uVar47 = uVar51 + (int)lVar35 + 2 | 1;
            lVar35 = lVar35 + 2;
            puVar37 = puVar37 + 8;
          } while ((int)uVar47 < iVar3);
          puVar36 = puVar24 + 8;
          uVar51 = uVar51 + (int)lVar35;
        }
        if ((int)uVar51 < iVar3) {
          uVar21 = (ulong)uVar51;
          lVar35 = 0;
          do {
            puVar36[lVar35 * 4] = *(undefined1 *)((long)pvVar42 + lVar35 + uVar21);
            puVar36[lVar35 * 4 + 1] = *(undefined1 *)((long)local_198 + lVar35 + uVar21);
            puVar36[lVar35 * 4 + 2] = *(undefined1 *)((long)local_168 + lVar35 + uVar21);
            puVar36[lVar35 * 4 + 3] = *(undefined1 *)((long)local_1a0 + lVar35 + uVar21);
            lVar35 = lVar35 + 1;
          } while ((int)((int)lVar35 + uVar51) < iVar3);
        }
        lVar35 = (long)iVar4 * sVar9 * uVar53;
        *(float *)((long)pvVar14 + lVar35 + lVar48) =
             1.0 / *(float *)((long)pvVar12 + uVar53 * 4 + lVar39);
        *(float *)((long)pvVar14 + lVar35 + lVar48 + 4) =
             1.0 / *(float *)((long)pvVar12 + lVar30 * 4 + lVar39);
        *(float *)((long)pvVar14 + lVar35 + lVar48 + 8) =
             1.0 / *(float *)((long)pvVar12 + lVar34 * 4 + lVar39);
        *(float *)((long)pvVar14 + lVar35 + lVar48 + 0xc) =
             1.0 / *(float *)((long)pvVar12 + lVar38 * 4 + lVar39);
        *(float *)((long)pvVar14 + lVar35 + lVar48 + 0x10) =
             1.0 / *(float *)((long)pvVar13 + uVar53 * 4 + lVar40);
        *(float *)((long)pvVar14 + lVar35 + lVar48 + 0x14) =
             1.0 / *(float *)((long)pvVar13 + lVar30 * 4 + lVar40);
        *(float *)((long)pvVar14 + lVar35 + lVar48 + 0x18) =
             1.0 / *(float *)((long)pvVar13 + lVar34 * 4 + lVar40);
        *(float *)((long)pvVar14 + lVar35 + lVar48 + 0x1c) =
             1.0 / *(float *)((long)pvVar13 + lVar38 * 4 + lVar40);
        puVar26 = puVar26 + 4;
        uVar53 = uVar53 + 1;
        pvVar32 = (void *)((long)pvVar32 + lVar33);
        pvVar45 = (void *)((long)pvVar45 + lVar33);
        pvVar43 = (void *)((long)pvVar43 + lVar33);
        pvVar41 = (void *)((long)pvVar41 + lVar33);
        pvVar52 = (void *)((long)pvVar52 + lVar23);
        local_f0 = local_f0 + lVar33;
        local_f8 = local_f8 + lVar33;
        local_100 = local_100 + lVar33;
        local_108 = local_108 + lVar33;
        local_1a0 = (void *)((long)local_1a0 + lVar25);
        local_168 = (void *)((long)local_168 + lVar25);
        local_198 = (void *)((long)local_198 + lVar25);
        pvVar42 = (void *)((long)pvVar42 + lVar25);
        local_118 = local_118 + lVar25;
        local_120 = local_120 + lVar25;
        local_128 = local_128 + lVar25;
        local_130 = local_130 + lVar25;
      } while (uVar53 != uVar46);
    }
    local_1b8 = local_1b8 + 1;
  } while (local_1b8 != _c);
  if (opt->lightmode == true) {
    piVar15 = (this->super_LSTM).weight_xc_data.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar1 = (this->super_LSTM).weight_xc_data.data;
        pAVar16 = (this->super_LSTM).weight_xc_data.allocator;
        if (pAVar16 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar16 + 0x18))();
        }
      }
    }
    (this->super_LSTM).weight_xc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
    (this->super_LSTM).weight_xc_data.data = (void *)0x0;
    (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data.dims = 0;
    (this->super_LSTM).weight_xc_data.w = 0;
    (this->super_LSTM).weight_xc_data.h = 0;
    (this->super_LSTM).weight_xc_data.d = 0;
    (this->super_LSTM).weight_xc_data.c = 0;
    piVar15 = (this->super_LSTM).bias_c_data.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar1 = (this->super_LSTM).bias_c_data.data;
        pAVar16 = (this->super_LSTM).bias_c_data.allocator;
        if (pAVar16 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar16 + 0x18))();
        }
      }
    }
    (this->super_LSTM).bias_c_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
    (this->super_LSTM).bias_c_data.data = (void *)0x0;
    (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
    (this->super_LSTM).bias_c_data.dims = 0;
    (this->super_LSTM).bias_c_data.w = 0;
    (this->super_LSTM).bias_c_data.h = 0;
    (this->super_LSTM).bias_c_data.d = 0;
    (this->super_LSTM).bias_c_data.c = 0;
    piVar15 = (this->super_LSTM).weight_hc_data.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar1 = (this->super_LSTM).weight_hc_data.data;
        pAVar16 = (this->super_LSTM).weight_hc_data.allocator;
        if (pAVar16 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar16 + 0x18))();
        }
      }
    }
    (this->super_LSTM).weight_hc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
    (this->super_LSTM).weight_hc_data.data = (void *)0x0;
    (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data.dims = 0;
    (this->super_LSTM).weight_hc_data.w = 0;
    (this->super_LSTM).weight_hc_data.h = 0;
    (this->super_LSTM).weight_hc_data.d = 0;
    (this->super_LSTM).weight_hc_data.c = 0;
    piVar15 = (this->super_LSTM).weight_xc_data_int8_scales.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar1 = (this->super_LSTM).weight_xc_data_int8_scales.data;
        pAVar16 = (this->super_LSTM).weight_xc_data_int8_scales.allocator;
        if (pAVar16 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar16 + 0x18))();
        }
      }
    }
    (this->super_LSTM).weight_xc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.elemsize + 4) = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.data = (void *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.c = 0;
    piVar15 = (this->super_LSTM).weight_hc_data_int8_scales.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar1 = (this->super_LSTM).weight_hc_data_int8_scales.data;
        pAVar16 = (this->super_LSTM).weight_hc_data_int8_scales.allocator;
        if (pAVar16 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar16 + 0x18))();
        }
      }
    }
    (this->super_LSTM).weight_hc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.elemsize + 4) = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.data = (void *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.c = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}